

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::detail::StringMakerBase<true>::convert<wchar_t[4]>
                   (String *__return_storage_ptr__,wchar_t (*in) [4])

{
  ostream *this;
  unsigned_long i;
  long lVar1;
  
  lVar1 = 0;
  this = tlssPush();
  do {
    std::ostream::operator<<(this,(*in)[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  tlssPop();
  return __return_storage_ptr__;
}

Assistant:

static String convert(const DOCTEST_REF_WRAP(T) in) {
            /* When parameter "in" is a null terminated const char* it works.
             * When parameter "in" is a T arr[N] without '\0' we can fill the
             * stringstream with N objects (T=char).If in is char pointer *
             * without '\0' , it would cause segfault
             * stepping over unaccessible memory.
             */

            std::ostream* stream = tlssPush();
            filloss(stream, in);
            return tlssPop();
        }